

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O3

void QHttpHeadersPrivate::replaceOrAppend(Self *d,HeaderName *name,QByteArray value)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  QHttpHeadersPrivate *pQVar4;
  iterator iVar5;
  iterator iVar6;
  undefined8 *in_RDX;
  Header *pHVar7;
  QList<Header> *pQVar8;
  long in_FS_OFFSET;
  undefined1 local_78 [8];
  Header local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QExplicitlySharedDataPointer<QHttpHeadersPrivate>::detach(d);
  iVar5 = QList<Header>::begin(&((d->d).ptr)->headers);
  iVar6 = QList<Header>::end(&((d->d).ptr)->headers);
  iVar5 = std::
          __find_if<QList<Header>::iterator,__gnu_cxx::__ops::_Iter_pred<headerNameMatches(HeaderName_const&)::__0>>
                    (iVar5,iVar6,
                     (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_network_access_qhttpheaders_cpp:785:12)>
                      )name);
  iVar6 = QList<Header>::end(&((d->d).ptr)->headers);
  if (iVar5.i == iVar6.i) {
    pQVar4 = (d->d).ptr;
    pQVar8 = &pQVar4->headers;
    local_70.name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index =
         *(__index_type *)
          ((long)&(name->data).super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                  super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                  super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                  super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                  super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                  super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18);
    local_78 = (undefined1  [8])&local_70;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
      ::_S_vtable._M_arr
      [(long)(char)local_70.name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>
                   .super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index
       + 1]._M_data)((anon_class_8_1_a78179b7 *)local_78,&name->data);
    local_70.value.d.d = (Data *)*in_RDX;
    local_70.value.d.ptr = (char *)in_RDX[1];
    *in_RDX = 0;
    in_RDX[1] = 0;
    local_70.value.d.size = in_RDX[2];
    in_RDX[2] = 0;
    QtPrivate::QGenericArrayOps<Header>::emplace<Header>
              ((QGenericArrayOps<Header> *)pQVar8,(pQVar4->headers).d.size,&local_70);
    QList<Header>::end(pQVar8);
    if (&(local_70.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_70.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_70.value.d.d)->super_QArrayData,1,0x10);
      }
    }
    if ((long)(char)local_70.name.data.
                    super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index
        != -1) {
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
        ::_S_vtable._M_arr
        [(char)local_70.name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index].
        _M_data)((anon_class_1_0_00000001 *)local_78,
                 (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)&local_70);
    }
  }
  else {
    pDVar1 = ((iVar5.i)->value).d.d;
    ((iVar5.i)->value).d.d = (Data *)*in_RDX;
    *in_RDX = pDVar1;
    pcVar2 = ((iVar5.i)->value).d.ptr;
    ((iVar5.i)->value).d.ptr = (char *)in_RDX[1];
    in_RDX[1] = pcVar2;
    qVar3 = ((iVar5.i)->value).d.size;
    ((iVar5.i)->value).d.size = in_RDX[2];
    in_RDX[2] = qVar3;
    pQVar8 = &((d->d).ptr)->headers;
    iVar6 = QList<Header>::end(pQVar8);
    iVar5 = std::
            __find_if<QList<Header>::iterator,__gnu_cxx::__ops::_Iter_pred<headerNameMatches(HeaderName_const&)::__0>>
                      (iVar5.i + 1,iVar6,
                       (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_network_access_qhttpheaders_cpp:785:12)>
                        )name);
    if ((iVar5.i != iVar6.i) && (pHVar7 = iVar5.i + 1, pHVar7 != iVar6.i)) {
      do {
        local_78[0] = 1;
        local_70.name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
        super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
        super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
        super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
        super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
        super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_u._0_8_ =
             local_78;
        local_70.name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
        super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
        super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
        super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
        super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
        super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_u._8_8_ = pHVar7;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
          ::_S_vtable._M_arr
          [(long)(char)*(__index_type *)
                        ((long)&(name->data).
                                super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>
                        + 0x18) + 1]._M_data)((anon_class_16_2_9763bfdf *)&local_70,&name->data);
        if (local_78[0] == '\0') {
          local_70.name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
          super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
          super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
          super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
          super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
          super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_u._0_8_ =
               iVar5.i;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
            ::_S_vtable._M_arr
            [(long)(char)*(__index_type *)
                          ((long)&(pHVar7->name).data.
                                  super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                  super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>
                                  .
                                  super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>
                                  .super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>
                                  .super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>
                          + 0x18) + 1]._M_data)
                    ((anon_class_8_1_8991fb9c *)&local_70,
                     (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)pHVar7);
          pDVar1 = ((iVar5.i)->value).d.d;
          ((iVar5.i)->value).d.d = (pHVar7->value).d.d;
          (pHVar7->value).d.d = pDVar1;
          pcVar2 = ((iVar5.i)->value).d.ptr;
          ((iVar5.i)->value).d.ptr = (pHVar7->value).d.ptr;
          (pHVar7->value).d.ptr = pcVar2;
          qVar3 = ((iVar5.i)->value).d.size;
          ((iVar5.i)->value).d.size = (pHVar7->value).d.size;
          (pHVar7->value).d.size = qVar3;
          iVar5.i = iVar5.i + 1;
        }
        pHVar7 = pHVar7 + 1;
      } while (pHVar7 != iVar6.i);
    }
    iVar6 = QList<Header>::end(&((d->d).ptr)->headers);
    QList<Header>::erase(pQVar8,(const_iterator)iVar5.i,(const_iterator)iVar6.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpHeadersPrivate::replaceOrAppend(Self &d, const HeaderName &name, QByteArray value)
{
    d.detach();
    auto it = std::find_if(d->headers.begin(), d->headers.end(), headerNameMatches(name));
    if (it != d->headers.end()) {
        // Found something to replace => replace, and then rearrange any remaining
        // matches to the end and erase them
        it->value = std::move(value);
        d->headers.erase(
                std::remove_if(it + 1, d->headers.end(), headerNameMatches(name)),
                d->headers.end());
    } else {
        // Found nothing to replace => append
        d->headers.append(Header{name, std::move(value)});
    }
}